

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O1

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::factory<std::function<double(double)>>
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t N,
          function<double_(double)> *func,double xmin,double xmax)

{
  ChebyshevExpansion *pCVar1;
  VectorXd *pVVar2;
  double *pdVar3;
  undefined8 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  double dVar7;
  VectorXd f;
  VectorXd local_78;
  double local_60;
  double local_58;
  ChebyshevExpansion *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_60 = xmin;
  local_58 = xmax;
  pVVar2 = get_CLnodes((size_t)this);
  puVar6 = (undefined1 *)
           ((long)&(this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data + 1);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((long)puVar6 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pdVar3 = local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_50 = __return_storage_ptr__;
  if (puVar6 != (undefined1 *)0x0) {
    free((void *)0x0);
    if (puVar6 != (undefined1 *)0x0) {
      if ((ulong)puVar6 >> 0x3d == 0) {
        pdVar3 = (double *)malloc((long)puVar6 * 8);
        if ((this != (ChebyshevExpansion *)0x0) && (((ulong)pdVar3 & 0xf) != 0)) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pdVar3 != (double *)0x0) goto LAB_00129ae0;
      }
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::random_device::_M_fini;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    pdVar3 = local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
  }
LAB_00129ae0:
  local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar3;
  local_40 = local_58 - local_60;
  local_48 = local_60 + local_58;
  puVar5 = (undefined1 *)0x0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)puVar6;
  while( true ) {
    if ((pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)puVar5) {
      __assert_fail("index >= 0 && index < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0xb5,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                   );
    }
    local_38 = ((pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data[(long)puVar5] * local_40 + local_48) * 0.5;
    if (*(long *)(N + 0x10) == 0) break;
    dVar7 = (double)(**(code **)(N + 0x18))(N,&local_38);
    pCVar1 = local_50;
    if (local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
        (long)puVar5) goto LAB_00129ba6;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    [(long)puVar5] = dVar7;
    puVar5 = puVar5 + 1;
    if (puVar6 == puVar5) {
      factoryf(local_50,(size_t)this,&local_78,local_60,local_58);
      free(local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return pCVar1;
    }
  }
  std::__throw_bad_function_call();
LAB_00129ba6:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

static ChebyshevExpansion factory(const std::size_t N, const double_function& func, const double xmin, const double xmax)
        {
            // Get the precalculated Chebyshev-Lobatto nodes
            const Eigen::VectorXd & x_nodes_n11 = get_CLnodes(N);

            // Step 1&2: Grid points functional values (function evaluated at the
            // extrema of the Chebyshev polynomial of order N - there are N+1 of them)
            Eigen::VectorXd f(N + 1);
            for (int k = 0; k <= N; ++k) {
                // The extrema in [-1,1] scaled to real-world coordinates
                double x_k = ((xmax - xmin)*x_nodes_n11(k) + (xmax + xmin)) / 2.0;
                f(k) = func(x_k);
            }
            return factoryf(N, f, xmin, xmax);
        }